

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_54(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  QPDFWriter w;
  long *local_48;
  long local_40;
  long local_38 [2];
  QPDFWriter local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  QPDFWriter::QPDFWriter(local_28,pdf,"a.pdf");
  QPDF::getPDFVersion_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar1 != 0) {
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)local_28);
    QPDFWriter::getFinalVersion_abi_cxx11_();
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"oops: ",6);
      QPDFWriter::getFinalVersion_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_48,local_40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  __assert_fail("pdf.getPDFVersion() != \"1.5\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x814,"void test_54(QPDF &, const char *)");
}

Assistant:

static void
test_54(QPDF& pdf, char const* arg2)
{
    // Test getFinalVersion. This must be invoked with a file
    // whose final version is not 1.5.
    QPDFWriter w(pdf, "a.pdf");
    assert(pdf.getPDFVersion() != "1.5");
    w.setObjectStreamMode(qpdf_o_generate);
    if (w.getFinalVersion() != "1.5") {
        std::cout << "oops: " << w.getFinalVersion() << std::endl;
    }
}